

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall lr_grammar::GrammarLR::get_tow_char_index(GrammarLR *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  value_type local_2c;
  undefined1 local_28 [4];
  int i;
  vector<int,_std::allocator<int>_> t;
  GrammarLR *this_local;
  
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_28);
  local_2c = 0;
  while( true ) {
    uVar1 = (ulong)local_2c;
    sVar2 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                      (&this->elements);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)local_2c);
    if (((pvVar3->super_Elem).is_finally & 1U) == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->not_finally_charIndex,&local_2c);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(&this->finally_charIndex,&local_2c);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->first,(value_type *)local_28);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->follow,(value_type *)local_28);
    local_2c = local_2c + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void GrammarLR::get_tow_char_index(){
    vector<int> t;
    t.clear();

    for (int i = 0; i < elements.size(); i++){
        if (elements[i].is_finally){
            finally_charIndex.push_back(i);
        }
        else
        {
            not_finally_charIndex.push_back(i);
        }
        first.push_back(t);
        follow.push_back(t);

    }

}